

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O3

void gimage::rgbToHSV<unsigned_char,gimage::PixelTraits<unsigned_char>>
               (ImageFloat *ret,Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image)

{
  uchar ***pppuVar1;
  float ***pppfVar2;
  long lVar3;
  long lVar4;
  float val;
  float sat;
  float hue;
  float local_44;
  float local_40;
  float local_3c;
  long local_38;
  
  Image<float,_gimage::PixelTraits<float>_>::setSize(ret,image->width,image->height,3);
  lVar4 = image->height;
  if (0 < lVar4) {
    lVar3 = image->width;
    local_38 = 0;
    do {
      if (0 < lVar3) {
        lVar4 = 0;
        do {
          pppuVar1 = image->img;
          rgbToHSV<int>(&local_3c,&local_40,&local_44,(uint)(*pppuVar1)[local_38][lVar4],
                        (uint)pppuVar1[1][local_38][lVar4],(uint)pppuVar1[2][local_38][lVar4],0xff);
          pppfVar2 = ret->img;
          (*pppfVar2)[local_38][lVar4] = local_3c;
          pppfVar2[1][local_38][lVar4] = local_40;
          pppfVar2[2][local_38][lVar4] = local_44;
          lVar4 = lVar4 + 1;
          lVar3 = image->width;
        } while (lVar4 < lVar3);
        lVar4 = image->height;
      }
      local_38 = local_38 + 1;
    } while (local_38 < lVar4);
  }
  return;
}

Assistant:

void rgbToHSV(ImageFloat &ret, const Image<T, traits> &image)
{
  float hue, sat, val;

  assert(image.getDepth() == 3);

  ret.setSize(image.getWidth(), image.getHeight(), 3);

  for (long k=0; k<image.getHeight(); k++)
  {
    for (long i=0; i<image.getWidth(); i++)
    {
      rgbToHSV(hue, sat, val, image.getW(i, k, 0), image.getW(i, k, 1),
               image.getW(i, k, 2), image.absMaxValue());

      ret.setLimited(i, k, 0, hue);
      ret.setLimited(i, k, 1, sat);
      ret.setLimited(i, k, 2, val);
    }
  }
}